

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-automation.cpp
# Opt level: O0

void test_relearn(void)

{
  printf("#Test Relearn\n");
  return;
}

Assistant:

void test_relearn(void)
{
    printf("#Test Relearn\n");
//    rtosc::MidiMapperRT rt;
//    rtosc::MidiMappernRT non_rt;
//
//    non_rt.base_ports = &p;
//    non_rt.rt_cb = non_rt_to_rt;
//    rt.setFrontendCb(rt_to_non_rt);
//    rt.setBackendCb(rt_to_rt);
//
//    assert_int_eq(0, non_rt.getMidiMappingStrings().size(),
//            "No mappings are available on initialization", __LINE__);
//
//    printf("#\n#Setup watch\n");
//    non_rt.map("/foo", true);
//    rt.addWatch();
//    printf("#\n#Learn binding\n");
//    rt.handleCC(5, 2);
//    non_rt.useFreeID(5);
//    assert_int_eq(1, non_rt.getMidiMappingStrings().size(),
//            "One mapping is available after learning", __LINE__);
//
//    printf("#\n#unlearn binding\n");
//    non_rt.unMap("/foo", false);
//    non_rt.unMap("/foo", true);
//    assert_int_eq(0, non_rt.getMidiMappingStrings().size(),
//            "No mappings are available after unlearning", __LINE__);
//
//    //printf("#\n#Setup watch2\n");
//    //non_rt.map("/foo", true);
//    //rt.addWatch();
//    //printf("#\n#Relearn binding\n");
//    //rt.handleCC(5, 2);
//    //non_rt.useFreeID(5);
//    delete storage;
//    storage = NULL;
//    return;
}